

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-util.c
# Opt level: O2

_Bool find_nearby_grid(chunk_conflict *c,loc_conflict *grid,loc_conflict centre,wchar_t yd,
                      wchar_t xd)

{
  _Bool _Var1;
  loc_conflict top_left;
  loc_conflict bottom_right;
  
  top_left = loc(centre.x - xd,centre.y - yd);
  bottom_right = loc(xd + centre.x,centre.y + yd);
  _Var1 = cave_find_in_range(c,grid,top_left,bottom_right,square_in_bounds_fully);
  return _Var1;
}

Assistant:

bool find_nearby_grid(struct chunk *c, struct loc *grid, struct loc centre,
	int yd, int xd)
{
	struct loc top_left = loc(centre.x - xd, centre.y - yd);
	struct loc bottom_right = loc(centre.x + xd, centre.y + yd);
	return cave_find_in_range(c, grid, top_left, bottom_right,
		square_in_bounds_fully);
}